

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmCpBcc<(moira::Instr)147,(moira::Mode)12,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char **s;
  u32 uVar1;
  int iVar2;
  char *pcVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    dasmIllegal<(moira::Instr)147,(moira::Mode)12,2>(this,str,addr,op);
    return;
  }
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar5 = (*this->_vptr_Moira[6])(this);
  *addr = *addr + 2;
  iVar6 = (*this->_vptr_Moira[6])(this);
  *addr = *addr + 2;
  iVar7 = (*this->_vptr_Moira[6])(this);
  s = &str->ptr;
  sprintd_signed(s,(ulong)(op >> 9 & 7));
  pcVar3 = str->ptr;
  str->ptr = pcVar3 + 1;
  *pcVar3 = 'b';
  StrWriter::operator<<(str,(Cpcc)(op & 0x3f));
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = ' ';
  }
  else {
    iVar2 = (str->tab).raw;
    do {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = ' ';
    } while (str->ptr < str->base + iVar2);
  }
  pcVar3 = str->ptr;
  str->ptr = pcVar3 + 1;
  *pcVar3 = '#';
  StrWriter::operator<<(str,(Int)(int)(short)iVar7);
  cVar4 = ';';
  lVar8 = 0;
  do {
    pcVar3 = *s;
    *s = pcVar3 + 1;
    *pcVar3 = cVar4;
    cVar4 = "; "[lVar8 + 1];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 2);
  StrWriter::operator<<(str,(UInt)((int)(short)iVar6 + uVar1 + 2));
  cVar4 = ' ';
  lVar8 = 1;
  do {
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = cVar4;
    cVar4 = "; (extension = "[lVar8 + 1];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0xf);
  StrWriter::operator<<(str,(Int)(uVar5 & 0xffff));
  cVar4 = ')';
  lVar8 = 1;
  do {
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = cVar4;
    cVar4 = "%ds%-4s  %s; (extension = $%x) (2-3)"[lVar8 + 0x1d];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 8);
  return;
}

Assistant:

void
Moira::dasmCpBcc(StrWriter &str, u32 &addr, u16 op) const
{
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        dasmIllegal<I, M, S>(str, addr, op);
        return;
    }

    auto id   = ( ____xxx_________(op) );
    auto cnd  = ( __________xxxxxx(op) );
    auto pc   = addr + 2;
    auto ext1 = dasmIncRead<Word>(addr);
    auto disp = dasmIncRead<S>(addr);
    auto ext2 = dasmIncRead<Word>(addr);

    pc += SEXT<S>(disp);

    str << id << Ins<I>{} << Cpcc{cnd} << str.tab << Ims<Word>(ext2);
    str << "; " << UInt(pc) << " (extension = " << Int(ext1) << ") (2-3)";
}